

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O3

void __thiscall
calculator::ZeroNumberException::ZeroNumberException(ZeroNumberException *this,int x)

{
  uint uVar1;
  long *plVar2;
  uint uVar3;
  long *plVar4;
  ulong uVar5;
  uint __val;
  uint __len;
  string __str;
  long *local_68 [2];
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__SyntaxError_001189d0;
  __val = -x;
  if (0 < x) {
    __val = x;
  }
  __len = 1;
  if (9 < __val) {
    uVar5 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar5;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_0010e222;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_0010e222;
      }
      if (uVar3 < 10000) goto LAB_0010e222;
      uVar5 = uVar5 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_0010e222:
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)__len - (char)(x >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)x >> 0x1f) + (long)local_68[0]),__len,__val);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,0x111dd7);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_38 = *plVar4;
    lStack_30 = plVar2[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar4;
    local_48 = (long *)*plVar2;
  }
  local_40 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_48
            );
  if (local_48 != &local_38) {
    operator_delete(local_48,local_38 + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return;
}

Assistant:

ZeroNumberException(int x) {
        error_msg = "Error: zero/0 number error: 0" + std::to_string(x);
    }